

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_move_scalar_from_top(Parser *this)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  State *pSVar4;
  pfn_error p_Var5;
  code *pcVar6;
  size_t sVar7;
  Location LVar8;
  Location LVar9;
  bool bVar10;
  State *pSVar11;
  csubstr cVar12;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  char msg [42];
  
  uVar3 = (this->m_stack).m_size;
  if (1 < uVar3) {
    pSVar4 = (this->m_stack).m_stack;
    pSVar11 = this->m_state;
    if (pSVar11 != pSVar4 + (uVar3 - 1)) {
      builtin_strncpy(msg + 0x20,"ck.top())",10);
      builtin_strncpy(msg + 0x10,"_state == &m_sta",0x10);
      builtin_strncpy(msg,"check failed: (m",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      p_Var5 = (this->m_stack).m_callbacks.m_error;
      cVar12 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_60 = cVar12.len;
      pcStack_68 = cVar12.str;
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7941) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x7941) << 0x40,8);
      LVar8.name.str = pcStack_68;
      LVar8.name.len = local_60;
      (*p_Var5)(msg,0x2a,LVar8,(this->m_stack).m_callbacks.m_user_data);
      pSVar11 = this->m_state;
    }
    if (pSVar11 == pSVar4 + (uVar3 - 2)) {
      builtin_strncpy(msg + 0x10,"_state != &prev)",0x11);
      builtin_strncpy(msg,"check failed: (m",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      p_Var5 = (this->m_stack).m_callbacks.m_error;
      cVar12 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_88 = cVar12.len;
      pcStack_90 = cVar12.str;
      LVar9.super_LineCol.col = 0;
      LVar9.super_LineCol.offset = SUB168(ZEXT816(0x7942) << 0x40,0);
      LVar9.super_LineCol.line = SUB168(ZEXT816(0x7942) << 0x40,8);
      LVar9.name.str = pcStack_90;
      LVar9.name.len = local_88;
      (*p_Var5)(msg,0x21,LVar9,(this->m_stack).m_callbacks.m_user_data);
    }
    uVar2 = pSVar4[uVar3 - 2].flags;
    if ((uVar2 >> 9 & 1) != 0) {
      pSVar11 = this->m_state;
      pSVar11->flags = pSVar11->flags | uVar2 & 0x600;
      sVar7 = pSVar4[uVar3 - 2].scalar.len;
      (pSVar11->scalar).str = pSVar4[uVar3 - 2].scalar.str;
      (pSVar11->scalar).len = sVar7;
      pbVar1 = (byte *)((long)&pSVar4[uVar3 - 2].flags + 1);
      *pbVar1 = *pbVar1 & 0xf9;
      pSVar4[uVar3 - 2].scalar.str = (char *)0x0;
      pSVar4[uVar3 - 2].scalar.len = 0;
    }
  }
  return;
}

Assistant:

size_t size() const { return m_size; }